

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O1

Base * __thiscall
Assimp::Blender::Structure::_allocate<Assimp::Blender::Base>
          (Structure *this,shared_ptr<Assimp::Blender::Base> *out,size_t *s)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Base *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  __p = (Base *)operator_new(0x38);
  (__p->super_ElemBase).dna_type = (char *)0x0;
  (__p->super_ElemBase)._vptr_ElemBase = (_func_int **)&PTR__Base_008008f8;
  __p->prev = (Base *)0x0;
  (__p->next).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->next).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->object).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->object).super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::Blender::Base*>
            (&_Stack_20,__p);
  _Var1._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (out->super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
            ._M_pi;
  (out->super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = __p;
  (out->super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var1._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  *s = 1;
  return (out->super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
}

Assistant:

T* _allocate(std::shared_ptr<T>& out, size_t& s) const {
        out = std::shared_ptr<T>(new T());
        s = 1;
        return out.get();
    }